

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpLayoutsCommon.h
# Opt level: O0

bool Js::LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_int,unsigned_int>(uint *dst,uint src)

{
  uint src_local;
  uint *dst_local;
  
  if ((DAT_01ea9f1d & 1) == 0) {
    *dst = src;
    dst_local._7_1_ = *dst == src;
  }
  else {
    dst_local._7_1_ = false;
  }
  return dst_local._7_1_;
}

Assistant:

static bool Assign(T1& dst, T2 src)
        {
#ifdef BYTECODE_TESTING
            if (Configuration::Global.flags.LargeByteCodeLayout)
            {
                return false;
            }
#endif
            dst = (T1)src;
            return ((T2)dst == src);
        }